

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_multi_noncentral_relative_pose_sac.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer piVar1;
  MultiNoncentralRelativePoseSacProblem *__p;
  ostream *poVar2;
  long lVar3;
  pointer pvVar4;
  ulong uVar5;
  size_t j;
  ulong uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar10;
  undefined1 auVar9 [16];
  undefined8 in_XMM2_Qb;
  timeval tVar11;
  timeval tVar12;
  shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
  relposeproblem_ptr;
  rotations_t camRotations;
  translations_t camOffsets;
  timeval tic;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  multiBearingVectors2;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  multiBearingVectors1;
  vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  gt;
  timeval toc;
  translation_t position2;
  rotation_t rotation1;
  translation_t position1;
  translation_t position;
  rotation_t rotation2;
  rotation_t rotation;
  NoncentralRelativeMultiAdapter adapter;
  __shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
  local_430;
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_420;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_400;
  timeval local_3e0;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_3d0;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_3b0;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_390;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_378;
  vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_360;
  timeval local_348;
  Vector3d local_338;
  rotation_t local_320;
  translation_t local_2d8;
  undefined1 local_2c0 [128];
  pointer local_240;
  pointer pvStack_238;
  pointer pvStack_230;
  pointer pvStack_228;
  pointer pvStack_220;
  pointer pvStack_218;
  __shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
  a_Stack_210 [2];
  translation_t local_1f0;
  Matrix3d local_1d8;
  rotation_t local_190;
  NoncentralRelativeMultiAdapter local_148;
  
  opengv::initializeRandomSeed();
  local_148.super_RelativeMultiAdapterBase.super_RelativeAdapterBase._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_2d8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_148);
  local_320.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  local_320.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_320.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_320.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_320.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  local_320.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_320.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_320.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_320.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  opengv::generateRandomTranslation(&local_338,2.0);
  opengv::generateRandomRotation(&local_1d8,0.5);
  local_400._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_420._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_400._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_400._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_420._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_420._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateRandomCameraSystem(4,(translations_t *)&local_400,(rotations_t *)&local_420);
  local_3b0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_360.
  super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_360.
  super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_360.
  super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateMulti2D2DCorrespondences
            (&local_2d8,&local_320,&local_338,&local_1d8,(translations_t *)&local_400,
             (rotations_t *)&local_420,0x19,0.3,0.1,&local_3b0,&local_3d0,&local_360);
  opengv::extractRelativePose
            (&local_2d8,&local_338,&local_320,&local_1d8,&local_1f0,&local_190,false);
  opengv::printExperimentCharacteristics(&local_1f0,&local_190,0.3,0.1);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector(&local_378,&local_3b0);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector(&local_390,&local_3d0);
  opengv::relative_pose::NoncentralRelativeMultiAdapter::NoncentralRelativeMultiAdapter
            (&local_148,&local_378,&local_390,(translations_t *)&local_400,(rotations_t *)&local_420
            );
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_390);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_378);
  local_2c0._8_4_ = 1000;
  local_2c0._16_8_ = 1.0;
  local_2c0._24_8_ = 0.99;
  local_240 = (pointer)0x0;
  pvStack_238 = (pointer)0x0;
  pvStack_230 = (pointer)0x0;
  pvStack_228 = (pointer)0x0;
  pvStack_220 = (pointer)0x0;
  pvStack_218 = (pointer)0x0;
  a_Stack_210[0]._M_ptr = (element_type *)0x0;
  a_Stack_210[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2c0._0_8_ = &PTR__MultiSampleConsensus_0040d7a8;
  __p = (MultiNoncentralRelativePoseSacProblem *)operator_new(0x13f0);
  opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem::
  MultiNoncentralRelativePoseSacProblem
            (__p,&local_148.super_RelativeMultiAdapterBase,SIXPT,false,true);
  std::
  __shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem,void>
            ((__shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem,(__gnu_cxx::_Lock_policy)2>
              *)&local_430,__p);
  std::
  __shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(a_Stack_210,&local_430);
  local_2c0._16_8_ = 7.812495421699595e-07;
  local_2c0._8_4_ = 100;
  gettimeofday(&local_3e0,(__timezone_ptr_t)0x0);
  opengv::sac::
  MultiRansac<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>::
  computeModel((MultiRansac<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
                *)local_2c0,0);
  gettimeofday(&local_348,(__timezone_ptr_t)0x0);
  tVar11 = timeval_minus((timeval *)&local_348,(timeval *)&local_3e0);
  tVar12 = timeval_minus((timeval *)&local_348,(timeval *)&local_3e0);
  std::operator<<((ostream *)&std::cout,"the ransac threshold is: ");
  poVar2 = std::ostream::_M_insert<double>((double)local_2c0._16_8_);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"the ransac results is: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)(local_2c0 + 0x20))
  ;
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Ransac needed ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_2c0._12_4_);
  uVar10 = extraout_XMM1_Qb;
  std::operator<<(poVar2," iterations and ");
  auVar9._0_8_ = (double)tVar11.tv_sec;
  auVar9._8_8_ = uVar10;
  auVar8._0_8_ = (double)tVar12.tv_usec;
  auVar8._8_8_ = in_XMM2_Qb;
  auVar8 = vfmadd132sd_fma(auVar8,auVar9,ZEXT816(0x3eb0c6f7a0b5ed8d));
  poVar2 = std::ostream::_M_insert<double>(auVar8._0_8_);
  poVar2 = std::operator<<(poVar2," seconds");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar3 = ((long)pvStack_220 - (long)pvStack_228) / 0x18;
  do {
    bVar7 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar7);
  poVar2 = std::operator<<((ostream *)&std::cout,"the number of inliers is: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"the found inliers are: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  pvVar4 = pvStack_228;
  for (uVar5 = 0; uVar5 < (ulong)(((long)pvStack_220 - (long)pvVar4) / 0x18); uVar5 = uVar5 + 1) {
    for (uVar6 = 0;
        piVar1 = pvVar4[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)pvVar4[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
        uVar6 = uVar6 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar1[uVar6]);
      std::operator<<(poVar2," ");
      pvVar4 = pvStack_228;
    }
  }
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_430._M_refcount);
  opengv::sac::
  MultiSampleConsensus<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>::
  ~MultiSampleConsensus
            ((MultiSampleConsensus<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
              *)local_2c0);
  opengv::relative_pose::NoncentralRelativeMultiAdapter::~NoncentralRelativeMultiAdapter(&local_148)
  ;
  std::
  vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::~vector(&local_360);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_3d0);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_3b0);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&local_420);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_400);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  // initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.3;
  double outlierFraction = 0.1;
  size_t pointsPerCam = 25;
  int numberCameras = 4;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomTranslation(2.0);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateRandomCameraSystem( numberCameras, camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  std::vector<std::shared_ptr<bearingVectors_t> > multiBearingVectors1;
  std::vector<std::shared_ptr<bearingVectors_t> > multiBearingVectors2;
  std::vector<std::shared_ptr<Eigen::MatrixXd> > gt;
  generateMulti2D2DCorrespondences(
      position1, rotation1, position2, rotation2, camOffsets, camRotations,
      pointsPerCam, noise, outlierFraction,
      multiBearingVectors1, multiBearingVectors2, gt );

  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation, false );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );
  
  //create a non-central relative multi-adapter
  relative_pose::NoncentralRelativeMultiAdapter adapter(
      multiBearingVectors1,
      multiBearingVectors2,
      camOffsets,
      camRotations);

  //Create a MultiNoncentralRelativePoseSacProblem and Ransac
  opengv::sac::MultiRansac<
      sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem> ransac;
  std::shared_ptr<
      sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem> relposeproblem_ptr(
      new sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem(
      adapter,
      sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem::SIXPT));
  ransac.sac_model_ = relposeproblem_ptr;
  ransac.threshold_ = 2.0*(1.0 - cos(atan(sqrt(2.0)*0.5/800.0)));
  ransac.max_iterations_ = 100;

  //Run the experiment
  struct timeval tic;
  struct timeval toc;
  gettimeofday( &tic, 0 );
  ransac.computeModel();
  gettimeofday( &toc, 0 );
  double ransac_time = TIMETODOUBLE(timeval_minus(toc,tic));

  //print the results
  std::cout << "the ransac threshold is: " << ransac.threshold_ << std::endl;
  std::cout << "the ransac results is: " << std::endl;
  std::cout << ransac.model_coefficients_ << std::endl << std::endl;
  std::cout << "Ransac needed " << ransac.iterations_ << " iterations and ";
  std::cout << ransac_time << " seconds" << std::endl << std::endl;
  size_t numberInliers = 0;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
    numberInliers += ransac.inliers_[i].size();
  std::cout << "the number of inliers is: " << numberInliers;
  std::cout << std::endl << std::endl;
  std::cout << "the found inliers are: " << std::endl;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
  {
    for(size_t j = 0; j < ransac.inliers_[i].size(); j++)
      std::cout << ransac.inliers_[i][j] << " ";
  }
  std::cout << std::endl << std::endl;
}